

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

optional<int> __thiscall Analyser::getIndexInGlobal(Analyser *this,string *s)

{
  bool bVar1;
  mapped_type *pmVar2;
  _Self local_30;
  _Self local_28;
  string *local_20;
  string *s_local;
  Analyser *this_local;
  
  local_20 = s;
  s_local = (string *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
       ::find(&this->_globalVars,s);
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
       ::end(&this->_globalVars);
  bVar1 = std::operator!=(&local_28,&local_30);
  if (bVar1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<bool,_int>_>_>_>
             ::operator[](&this->_globalVars,local_20);
    std::optional<int>::optional<int_&,_true>((optional<int> *)&this_local,&pmVar2->second);
  }
  else {
    std::optional<int>::optional((optional<int> *)&this_local);
  }
  return (_Optional_base<int,_true,_true>)(_Optional_base<int,_true,_true>)this_local;
}

Assistant:

std::optional<std::int32_t> Analyser::getIndexInGlobal(const std::string& s) {
	if (_globalVars.find(s) != _globalVars.end()) {
		return _globalVars[s].second;
	}
	else {
		return {};
	}
}